

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_tests.cpp
# Opt level: O2

void __thiscall test::spi_test::SPITest::SPITest(SPITest *this)

{
  int i;
  int iVar1;
  long lVar2;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__SPITest_0039b548;
  this->da = 0.0;
  this->null_str = (char *)0x0;
  this->a = 0;
  this->b = 0;
  this->fa = 0.0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->sa,"a",&local_19);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->sb,"b",&local_1a);
  (this->sa2)._M_dataplus._M_p = (pointer)&(this->sa2).field_2;
  (this->sa2)._M_string_length = 0;
  (this->sa2).field_2._M_local_buf[0] = '\0';
  (this->ox).ma = 0;
  (this->ox).mb = 1;
  *(undefined8 *)&(this->ox).mc = 2;
  (this->oy).mb = 0;
  (this->oy).mc = 0;
  *(undefined4 *)
   &(this->v).
    super__Variant_base<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_float,_std::__cxx11::basic_string<char>_>._M_u = 1;
  *(__index_type *)
   ((long)&(this->v).
           super__Variant_base<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<int,_float,_std::__cxx11::basic_string<char>_> + 0x20) =
       '\0';
  this->lda = (longdouble)0;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    iVar1 = (int)lVar2;
    this->ab[lVar2] = iVar1;
    this->aa2[lVar2] = iVar1;
    this->aa[lVar2] = iVar1;
    this->ac[lVar2] = (&DAT_0031e284)[lVar2];
  }
  this->ab[5] = 5;
  return;
}

Assistant:

SPITest()
        : null_str(NULL)
        , a(0), b(0)
        , fa(0.0f)
        , da(0.0)
        , sa("a")
        , sb("b")
        , ox(0, 1, 2)
        , oy(0, 0, 0)
#if IUTEST_HAS_CXX_HDR_VARIANT
        , v(1)
#endif
#if IUTEST_HAS_LONG_DOUBLE
        , lda(0.0l)
#endif
    {
        const char ac_[5] = { 0, 0, 2, 3, 5 };
        for( int i=0; i < 5; ++i )
        {
            aa[i] = aa2[i] = ab[i] = i;
            ac[i] = ac_[i];
        }
        ab[5] = 5;
    }